

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

bool __thiscall ON_COMPONENT_INDEX::IsMeshComponentIndex(ON_COMPONENT_INDEX *this)

{
  bool local_11;
  bool rc;
  ON_COMPONENT_INDEX *this_local;
  
  local_11 = false;
  if (this->m_type - mesh_vertex < 5) {
    local_11 = -1 < this->m_index;
  }
  return local_11;
}

Assistant:

bool ON_COMPONENT_INDEX::IsMeshComponentIndex() const
{
  bool rc = false;
  switch(m_type)
  {
  case ON_COMPONENT_INDEX::mesh_vertex:
  case ON_COMPONENT_INDEX::meshtop_vertex:
  case ON_COMPONENT_INDEX::meshtop_edge:
  case ON_COMPONENT_INDEX::mesh_face:
  case ON_COMPONENT_INDEX::mesh_ngon:
    if ( m_index >= 0 )
    {
      rc = true;
    }
    break;
  default:
    // intentionally skipping other ON_COMPONENT_INDEX::TYPE enum values
    break;
  }
  return rc;
}